

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::HugeIntegerCastOperation::
     HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
               (HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *state,uint8_t digit)

{
  bool bVar1;
  undefined3 in_register_00000031;
  
  if ((state->intermediate <
       (long)((ulong)CONCAT31(in_register_00000031,digit) | 0x8000000000000000) / 10) &&
     (bVar1 = HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::Flush(state), !bVar1)) {
    return false;
  }
  state->intermediate = state->intermediate * 10 - (ulong)CONCAT31(in_register_00000031,digit);
  state->digits = state->digits + '\x01';
  return true;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		if (NEGATIVE) {
			if (DUCKDB_UNLIKELY(state.intermediate <
			                    (NumericLimits<typename T::IntermediateType>::Minimum() + digit) / 10)) {
				// intermediate is full: need to flush it
				if (!state.Flush()) {
					return false;
				}
			}
			state.intermediate = state.intermediate * 10 - digit;
		} else {
			if (DUCKDB_UNLIKELY(state.intermediate >
			                    (NumericLimits<typename T::IntermediateType>::Maximum() - digit) / 10)) {
				if (!state.Flush()) {
					return false;
				}
			}
			state.intermediate = state.intermediate * 10 + digit;
		}
		state.digits++;
		return true;
	}